

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O0

bool cmMarkAsAdvancedCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *psVar1;
  string *psVar2;
  cmState *this;
  char *__s;
  cmExecutionStatus *this_00;
  bool bVar3;
  PolicyStatus PVar4;
  const_reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  cmMakefile *this_01;
  cmake *this_02;
  byte local_271;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  cmValue local_180;
  allocator<char> local_171;
  string local_170;
  cmValue local_150;
  cmValue local_148;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  undefined1 local_e0 [8];
  string err;
  cmValue local_b8;
  allocator<char> local_a9;
  string local_a8;
  byte local_83;
  byte local_82;
  byte local_81;
  bool ignoreVariable;
  bool oldBehavior;
  const_reference pvStack_80;
  bool issueMessage;
  string *variable;
  cmState *state;
  cmMakefile *mf;
  char *pcStack_60;
  bool overwrite;
  char *value;
  uint i;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  this_00 = local_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    return false;
  }
  value._0_4_ = 0;
  pcStack_60 = "1";
  mf._7_1_ = 0;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  bVar3 = std::operator==(pvVar5,"CLEAR");
  if (!bVar3) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    bVar3 = std::operator==(pvVar5,"FORCE");
    if (!bVar3) goto LAB_00465377;
  }
  mf._7_1_ = 1;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  bVar3 = std::operator==(pvVar5,"CLEAR");
  if (bVar3) {
    pcStack_60 = "0";
  }
  value._0_4_ = 1;
LAB_00465377:
  state = (cmState *)cmExecutionStatus::GetMakefile(local_20);
  variable = (string *)cmMakefile::GetState((cmMakefile *)state);
  do {
    uVar6 = (ulong)(uint)value;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (sVar7 <= uVar6) {
      return true;
    }
    pvStack_80 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)(uint)value);
    local_81 = 0;
    local_82 = 0;
    local_83 = 0;
    PVar4 = cmMakefile::GetPolicyStatus((cmMakefile *)state,CMP0102,false);
    this = state;
    if (PVar4 == OLD) {
LAB_004654fd:
      local_82 = 1;
    }
    else {
      if (PVar4 == WARN) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"CMAKE_POLICY_WARNING_CMP0102",&local_a9);
        bVar3 = cmMakefile::PolicyOptionalWarningEnabled((cmMakefile *)this,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
        if (bVar3) {
          local_b8 = cmState::GetCacheEntryValue(variable,pvStack_80);
          bVar3 = cmValue::operator_cast_to_bool(&local_b8);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            local_81 = 1;
          }
        }
        goto LAB_004654fd;
      }
      if (PVar4 - NEW < 3) {
        err.field_2._8_8_ = cmState::GetCacheEntryValue((cmState *)variable,pvStack_80);
        bVar3 = cmValue::operator_cast_to_bool((cmValue *)((long)&err.field_2 + 8));
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          local_83 = 1;
        }
      }
    }
    if ((local_81 & 1) != 0) {
      cmAlphaNum::cmAlphaNum(&local_110,"Policy CMP0102 is not set: The variable named \"");
      cmAlphaNum::cmAlphaNum(&local_140,pvStack_80);
      cmStrCat<char[250]>((string *)local_e0,&local_110,&local_140,
                          (char (*) [250])
                          "\" is not in the cache. This results in an empty cache entry which is no longer created when policy CMP0102 is set to NEW. Run \"cmake --help-policy CMP0102\" for policy details. Use the cmake_policy command to set the policy and suppress this warning."
                         );
      cmMakefile::IssueMessage((cmMakefile *)state,AUTHOR_WARNING,(string *)local_e0);
      std::__cxx11::string::~string((string *)local_e0);
    }
    if ((local_83 & 1) == 0) {
      if ((local_82 & 1) != 0) {
        local_148 = cmState::GetCacheEntryValue(variable,pvStack_80);
        bVar3 = cmValue::operator_cast_to_bool(&local_148);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          this_01 = cmExecutionStatus::GetMakefile(local_20);
          this_02 = cmMakefile::GetCMakeInstance(this_01);
          cmake::AddCacheEntry(this_02,pvStack_80,(char *)0x0,(char *)0x0,6);
          mf._7_1_ = 1;
        }
      }
      local_150 = cmState::GetCacheEntryValue(variable,pvStack_80);
      bVar3 = cmValue::operator_cast_to_bool(&local_150);
      psVar2 = variable;
      psVar1 = pvStack_80;
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"This should never happen...",&local_171);
        cmSystemTools::Error(&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
        return false;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"ADVANCED",&local_1a1)
      ;
      local_180 = cmState::GetCacheEntryProperty(psVar2,psVar1,&local_1a0);
      bVar3 = cmValue::operator_cast_to_bool(&local_180);
      local_271 = 1;
      if (bVar3) {
        local_271 = mf._7_1_;
      }
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      psVar2 = variable;
      psVar1 = pvStack_80;
      if ((local_271 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"ADVANCED",&local_1c9);
        __s = pcStack_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,__s,&local_1f1);
        cmState::SetCacheEntryProperty((cmState *)psVar2,psVar1,&local_1c8,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
      }
    }
    value._0_4_ = (uint)value + 1;
  } while( true );
}

Assistant:

bool cmMarkAsAdvancedCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  unsigned int i = 0;
  const char* value = "1";
  bool overwrite = false;
  if (args[0] == "CLEAR" || args[0] == "FORCE") {
    overwrite = true;
    if (args[0] == "CLEAR") {
      value = "0";
    }
    i = 1;
  }

  cmMakefile& mf = status.GetMakefile();
  cmState* state = mf.GetState();

  for (; i < args.size(); ++i) {
    std::string const& variable = args[i];

    bool issueMessage = false;
    bool oldBehavior = false;
    bool ignoreVariable = false;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0102)) {
      case cmPolicies::WARN:
        if (mf.PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0102")) {
          if (!state->GetCacheEntryValue(variable)) {
            issueMessage = true;
          }
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        oldBehavior = true;
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        if (!state->GetCacheEntryValue(variable)) {
          ignoreVariable = true;
        }
        break;
    }

    // First see if we should issue a message about CMP0102
    if (issueMessage) {
      std::string err = cmStrCat(
        "Policy CMP0102 is not set: The variable named \"", variable,
        "\" is not in the cache. This results in an empty cache entry which "
        "is no longer created when policy CMP0102 is set to NEW. Run \"cmake "
        "--help-policy CMP0102\" for policy details. Use the cmake_policy "
        "command to set the policy and suppress this warning.");
      mf.IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    // If it's not in the cache and we're using the new behavior, nothing to
    // see here.
    if (ignoreVariable) {
      continue;
    }

    // Check if we want the old behavior of making a dummy cache entry.
    if (oldBehavior) {
      if (!state->GetCacheEntryValue(variable)) {
        status.GetMakefile().GetCMakeInstance()->AddCacheEntry(
          variable, nullptr, nullptr, cmStateEnums::UNINITIALIZED);
        overwrite = true;
      }
    }

    // We need a cache entry to do this.
    if (!state->GetCacheEntryValue(variable)) {
      cmSystemTools::Error("This should never happen...");
      return false;
    }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite) {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
    }
  }
  return true;
}